

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O2

void __thiscall
CharStringType2Interpreter::~CharStringType2Interpreter(CharStringType2Interpreter *this)

{
  std::_Vector_base<CharStringOperand,_std::allocator<CharStringOperand>_>::~_Vector_base
            (&(this->mStorage).
              super__Vector_base<CharStringOperand,_std::allocator<CharStringOperand>_>);
  std::__cxx11::_List_base<CharStringOperand,_std::allocator<CharStringOperand>_>::_M_clear
            ((_List_base<CharStringOperand,_std::allocator<CharStringOperand>_> *)this);
  return;
}

Assistant:

CharStringType2Interpreter::~CharStringType2Interpreter(void)
{
}